

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O0

void tommy_hashdyn_resize(tommy_hashdyn *hashdyn,tommy_count_t new_bucket_bit)

{
  uint uVar1;
  long lVar2;
  tommy_node_struct *ptVar3;
  uint uVar4;
  uint uVar5;
  tommy_hashdyn_node **pptVar6;
  long in_FS_OFFSET;
  uint local_58;
  tommy_count_t i_1;
  tommy_count_t pos;
  tommy_hashdyn_node *j_next;
  tommy_hashdyn_node *j;
  tommy_count_t i;
  tommy_hashdyn_node **new_bucket;
  tommy_count_t new_bucket_mask;
  tommy_count_t new_bucket_max;
  tommy_count_t bucket_max;
  tommy_count_t bucket_bit;
  tommy_count_t new_bucket_bit_local;
  tommy_hashdyn *hashdyn_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = hashdyn->bucket_bit;
  uVar1 = hashdyn->bucket_max;
  uVar4 = 1 << ((byte)new_bucket_bit & 0x1f);
  pptVar6 = (tommy_hashdyn_node **)lrtr_malloc((ulong)uVar4 << 3);
  if (uVar5 < new_bucket_bit) {
    for (j._4_4_ = 0; j._4_4_ < uVar1; j._4_4_ = j._4_4_ + 1) {
      pptVar6[j._4_4_] = (tommy_hashdyn_node *)0x0;
      pptVar6[j._4_4_ + uVar1] = (tommy_hashdyn_node *)0x0;
      j_next = hashdyn->bucket[j._4_4_];
      while (j_next != (tommy_hashdyn_node *)0x0) {
        ptVar3 = j_next->next;
        uVar5 = j_next->key & uVar4 - 1;
        if (pptVar6[uVar5] == (tommy_hashdyn_node *)0x0) {
          tommy_list_insert_first(pptVar6 + uVar5,j_next);
          j_next = ptVar3;
        }
        else {
          tommy_list_insert_tail_not_empty(pptVar6[uVar5],j_next);
          j_next = ptVar3;
        }
      }
    }
  }
  else {
    for (local_58 = 0; local_58 < uVar4; local_58 = local_58 + 1) {
      pptVar6[local_58] = hashdyn->bucket[local_58];
      tommy_list_concat(pptVar6 + local_58,hashdyn->bucket + (local_58 + uVar4));
    }
  }
  lrtr_free(hashdyn->bucket);
  hashdyn->bucket_bit = new_bucket_bit;
  hashdyn->bucket_max = uVar4;
  hashdyn->bucket_mask = uVar4 - 1;
  hashdyn->bucket = pptVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void tommy_hashdyn_resize(tommy_hashdyn* hashdyn, tommy_count_t new_bucket_bit)
{
	tommy_count_t bucket_bit;
	tommy_count_t bucket_max;
	tommy_count_t new_bucket_max;
	tommy_count_t new_bucket_mask;
	tommy_hashdyn_node** new_bucket;

	bucket_bit = hashdyn->bucket_bit;
	bucket_max = hashdyn->bucket_max;

	new_bucket_max = 1 << new_bucket_bit;
	new_bucket_mask = new_bucket_max - 1;

	/* allocate the new vector using malloc() and not calloc() */
	/* because data is fully initialized in the update process */
	new_bucket = tommy_cast(tommy_hashdyn_node**, tommy_malloc(new_bucket_max * sizeof(tommy_hashdyn_node*)));

	/* reinsert all the elements */
	if (new_bucket_bit > bucket_bit) {
		tommy_count_t i;

		/* grow */
		for (i = 0; i < bucket_max; ++i) {
			tommy_hashdyn_node* j;

			/* setup the new two buckets */
			new_bucket[i] = 0;
			new_bucket[i + bucket_max] = 0;

			/* reinsert the bucket */
			j = hashdyn->bucket[i];
			while (j) {
				tommy_hashdyn_node* j_next = j->next;
				tommy_count_t pos = j->key & new_bucket_mask;
				if (new_bucket[pos])
					tommy_list_insert_tail_not_empty(new_bucket[pos], j);
				else
					tommy_list_insert_first(&new_bucket[pos], j);
				j = j_next;
			}
		}
	} else {
		tommy_count_t i;

		/* shrink */
		for (i = 0; i < new_bucket_max; ++i) {
			/* setup the new bucket with the lower bucket*/
			new_bucket[i] = hashdyn->bucket[i];

			/* concat the upper bucket */
			tommy_list_concat(&new_bucket[i], &hashdyn->bucket[i + new_bucket_max]);
		}
	}

	tommy_free(hashdyn->bucket);

	/* setup */
	hashdyn->bucket_bit = new_bucket_bit;
	hashdyn->bucket_max = new_bucket_max;
	hashdyn->bucket_mask = new_bucket_mask;
	hashdyn->bucket = new_bucket;
}